

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O3

uint32_t c_v128_movemask_8(c_v128 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint32_t uVar10;
  uint64_t uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  
  uVar9 = a.u64[1];
  uVar11 = a.u64[0];
  auVar12._8_8_ = uVar9;
  auVar12._0_8_ = uVar9;
  auVar12._16_8_ = uVar9;
  auVar12._24_8_ = uVar9;
  auVar12 = vpsrlvq_avx2(auVar12,_DAT_00bf1200);
  auVar1 = vshufps_avx(auVar12._0_16_,auVar12._16_16_,0x88);
  uVar4 = (uint)(uVar9 >> 0x14);
  uVar6 = uVar4 & 0xfff;
  uVar7 = a.u32[2] >> 0xd;
  uVar5 = (uint)(uVar9 >> 6);
  uVar8 = uVar5 & 0x3ffffff;
  iVar3 = a.u32[2] * 2;
  auVar13._8_8_ = uVar11;
  auVar13._0_8_ = uVar11;
  auVar13._16_8_ = uVar11;
  auVar13._24_8_ = uVar11;
  auVar12 = vpsrlvq_avx2(auVar13,_DAT_00bf1220);
  auVar2 = vshufps_avx(auVar12._0_16_,auVar12._16_16_,0x88);
  uVar10 = a.u32[0];
  auVar15._4_4_ = uVar10;
  auVar15._0_4_ = uVar10;
  auVar15._8_4_ = uVar10;
  auVar15._12_4_ = uVar10;
  auVar15 = vpsrlvd_avx2(auVar15,_DAT_00bf1a60);
  auVar14._16_16_ = auVar15;
  auVar14._0_16_ = auVar2;
  auVar16._0_8_ = CONCAT44(uVar4,uVar4) & 0xfff00000fff;
  auVar16._8_4_ = uVar6;
  auVar16._12_4_ = uVar6;
  auVar16._16_4_ = uVar6;
  auVar16._20_4_ = uVar6;
  auVar16._24_4_ = uVar6;
  auVar16._28_4_ = uVar6;
  auVar12 = vblendps_avx(ZEXT1632(auVar1),auVar16,0x10);
  auVar17._4_4_ = uVar7;
  auVar17._0_4_ = uVar7;
  auVar17._8_4_ = uVar7;
  auVar17._12_4_ = uVar7;
  auVar17._16_4_ = uVar7;
  auVar17._20_4_ = uVar7;
  auVar17._24_4_ = uVar7;
  auVar17._28_4_ = uVar7;
  auVar12 = vblendps_avx(auVar12,auVar17,0x20);
  auVar18._0_8_ = CONCAT44(uVar5,uVar5) & 0x3ffffff03ffffff;
  auVar18._8_4_ = uVar8;
  auVar18._12_4_ = uVar8;
  auVar18._16_4_ = uVar8;
  auVar18._20_4_ = uVar8;
  auVar18._24_4_ = uVar8;
  auVar18._28_4_ = uVar8;
  auVar13 = vblendps_avx(auVar12,auVar18,0x40);
  auVar19._4_4_ = iVar3;
  auVar19._0_4_ = iVar3;
  auVar19._8_4_ = iVar3;
  auVar19._12_4_ = iVar3;
  auVar19._16_4_ = iVar3;
  auVar19._20_4_ = iVar3;
  auVar19._24_4_ = iVar3;
  auVar19._28_4_ = iVar3;
  auVar12 = vandps_avx(auVar14,_DAT_00bf1240);
  auVar13 = vblendps_avx(auVar13,auVar19,0x80);
  auVar13 = vandps_avx(auVar13,_DAT_00bf1260);
  auVar12 = vorps_avx(auVar12,auVar13);
  auVar1 = vorps_avx(auVar12._0_16_,auVar12._16_16_);
  auVar2 = vshufps_avx(auVar1,auVar1,0xee);
  auVar1 = vorps_avx(auVar1,auVar2);
  auVar2 = vshufps_avx(auVar1,auVar1,0x55);
  auVar1 = vorps_avx(auVar1,auVar2);
  return auVar1._0_4_;
}

Assistant:

SIMD_INLINE uint32_t c_v128_movemask_8(c_v128 a) {
  return ((a.s8[15] < 0) << 15) | ((a.s8[14] < 0) << 14) |
         ((a.s8[13] < 0) << 13) | ((a.s8[12] < 0) << 12) |
         ((a.s8[11] < 0) << 11) | ((a.s8[10] < 0) << 10) |
         ((a.s8[9] < 0) << 9) | ((a.s8[8] < 0) << 8) | ((a.s8[7] < 0) << 7) |
         ((a.s8[6] < 0) << 6) | ((a.s8[5] < 0) << 5) | ((a.s8[4] < 0) << 4) |
         ((a.s8[3] < 0) << 3) | ((a.s8[2] < 0) << 2) | ((a.s8[1] < 0) << 1) |
         ((a.s8[0] < 0) << 0);
}